

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QOpenGLTexture *t)

{
  QOpenGLTexturePrivate *pQVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  QDebug QVar5;
  long *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QDebugStateSaver saver;
  GLint boundTextureId;
  QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_> local_d0;
  QDebug local_c8;
  QDebug local_c0;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_> local_80;
  QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_> local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)t);
  pQVar1 = (t->d_ptr).d;
  *(undefined1 *)&pQVar1->requestedMipLevels = 0;
  QVar6.m_data = (storage_type *)0xf;
  QVar6.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
  piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
    }
  }
  pQVar1 = (t->d_ptr).d;
  if ((char)pQVar1->requestedMipLevels == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  if (in_RDX == (long *)0x0) {
    QTextStream::operator<<((QTextStream *)(t->d_ptr).d,'0');
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
  }
  else {
    lVar2 = *in_RDX;
    local_78.d = (t->d_ptr).d;
    (local_78.d)->dimensions[1] = (local_78.d)->dimensions[1] + 1;
    qt_QMetaEnum_debugOperator
              (&local_70,(longlong)&local_78,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x10),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_70.stream;
    QVar7.m_data = (storage_type *)0x10;
    QVar7.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    local_68.stream = local_70.stream;
    *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_60,(longlong)&local_68,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x14),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_60.stream;
    QVar8.m_data = (storage_type *)0x8;
    QVar8.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_60.stream,*(int *)(lVar2 + 0x24));
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    QVar5.stream = local_60.stream;
    QVar9.m_data = (storage_type *)0x2;
    QVar9.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_60.stream,*(int *)(lVar2 + 0x28));
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug((QDebug *)&local_78);
    if (*(int *)(lVar2 + 0x10) == 0x806f) {
      pQVar1 = (t->d_ptr).d;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
      piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
        }
      }
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
      QTextStream::operator<<((QTextStream *)(t->d_ptr).d,*(int *)(lVar2 + 0x2c));
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
    }
    pQVar1 = (t->d_ptr).d;
    QVar11.m_data = (storage_type *)0xa;
    QVar11.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    local_80.d = (t->d_ptr).d;
    (local_80.d)->dimensions[1] = (local_80.d)->dimensions[1] + 1;
    qt_QMetaEnum_debugOperator
              (&local_60,(longlong)&local_80,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x1c),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_60.stream;
    QVar12.m_data = (storage_type *)0xe;
    QVar12.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_60.stream,*(int *)(lVar2 + 0x20));
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug((QDebug *)&local_80);
    if (*(int *)(*in_RDX + 0x18) != 0) {
      pQVar1 = (t->d_ptr).d;
      QVar13.m_data = (storage_type *)0xc;
      QVar13.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
      piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
        }
      }
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
      QTextStream::operator<<((QTextStream *)(t->d_ptr).d,*(uint *)(lVar2 + 0x18));
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
    }
    lVar3 = *in_RDX;
    local_50.d.d._0_4_ = 0;
    (**(code **)(**(long **)(lVar3 + 0xb8) + 200))(*(undefined4 *)(lVar3 + 0x14),&local_50);
    if ((int)local_50.d.d == *(int *)(lVar3 + 0x18)) {
      pQVar1 = (t->d_ptr).d;
      QVar14.m_data = (storage_type *)0x9;
      QVar14.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
      piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
        }
      }
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
    }
    if (*(char *)(*in_RDX + 0xac) == '\x01') {
      pQVar1 = (t->d_ptr).d;
      QVar15.m_data = (storage_type *)0x8;
      QVar15.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
      piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
        }
      }
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
    }
    if (*(char *)(lVar2 + 0x44) == '\x01') {
      pQVar1 = (t->d_ptr).d;
      QVar16.m_data = (storage_type *)0x18;
      QVar16.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
      piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
        }
      }
      pQVar1 = (t->d_ptr).d;
      if ((char)pQVar1->requestedMipLevels == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar1,' ');
      }
    }
    pQVar1 = (t->d_ptr).d;
    QVar17.m_data = (storage_type *)0xc;
    QVar17.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    QTextStream::operator<<((QTextStream *)(t->d_ptr).d,*(int *)(lVar2 + 0x30));
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    pQVar1 = (t->d_ptr).d;
    QVar18.m_data = (storage_type *)0x9;
    QVar18.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    QTextStream::operator<<((QTextStream *)(t->d_ptr).d,*(int *)(lVar2 + 0x38));
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    pQVar1 = (t->d_ptr).d;
    QVar19.m_data = (storage_type *)0x8;
    QVar19.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    QTextStream::operator<<((QTextStream *)(t->d_ptr).d,*(int *)(lVar2 + 0x3c));
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    pQVar1 = (t->d_ptr).d;
    QVar20.m_data = (storage_type *)0xa;
    QVar20.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    QTextStream::operator<<((QTextStream *)(t->d_ptr).d,*(int *)(lVar2 + 0x40));
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    pQVar1 = (t->d_ptr).d;
    QVar21.m_data = (storage_type *)0x13;
    QVar21.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    pQVar1 = (t->d_ptr).d;
    if ((char)pQVar1->requestedMipLevels == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
    }
    local_d0.d = (t->d_ptr).d;
    (local_d0.d)->dimensions[1] = (local_d0.d)->dimensions[1] + 1;
    qt_QMetaEnum_debugOperator
              (&local_c8,(longlong)&local_d0,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x60),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_c8.stream;
    QVar22.m_data = (storage_type *)0x15;
    QVar22.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar22);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
    }
    local_c0.stream = local_c8.stream;
    *(int *)(local_c8.stream + 0x28) = *(int *)(local_c8.stream + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_b8,(longlong)&local_c0,(QMetaObject *)(ulong)*(uint *)(lVar2 + 100),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_b8.stream;
    QVar23.m_data = (storage_type *)0x11;
    QVar23.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar23);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8.stream,*(int *)(lVar2 + 0x68));
    if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
    }
    QVar5.stream = local_b8.stream;
    QVar24.m_data = (storage_type *)0xb;
    QVar24.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar24);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
    }
    local_b0.stream = local_b8.stream;
    *(int *)(local_b8.stream + 0x28) = *(int *)(local_b8.stream + 0x28) + 1;
    qt_QMetaEnum_flagDebugOperator
              (&local_a8,(ulonglong)&local_b0,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0xc0),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_a8.stream;
    QVar25.m_data = (storage_type *)0x15;
    QVar25.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar25);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    local_a0.stream = local_a8.stream;
    *(int *)(local_a8.stream + 0x28) = *(int *)(local_a8.stream + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_70,(longlong)&local_a0,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x6c),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_70.stream;
    QVar26.m_data = (storage_type *)0x16;
    QVar26.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar26);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    local_98.stream = local_70.stream;
    *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_60,(longlong)&local_98,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x70),
               (char *)&QOpenGLTexture::staticMetaObject);
    QVar5.stream = local_60.stream;
    QVar27.m_data = (storage_type *)0xb;
    QVar27.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar27);
    QTextStream::operator<<((QTextStream *)QVar5.stream,&local_50);
    piVar4 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    local_90.stream = local_60.stream;
    *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_88,(longlong)&local_90,(QMetaObject *)(ulong)*(uint *)(lVar2 + 0x78),
               (char *)&QOpenGLTexture::staticMetaObject);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_98);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug(&local_a0);
    QDebug::~QDebug(&local_a8);
    QDebug::~QDebug(&local_b0);
    QDebug::~QDebug(&local_b8);
    QDebug::~QDebug(&local_c0);
    QDebug::~QDebug(&local_c8);
    QDebug::~QDebug((QDebug *)&local_d0);
  }
  QTextStream::operator<<((QTextStream *)(t->d_ptr).d,')');
  pQVar1 = (t->d_ptr).d;
  if ((char)pQVar1->requestedMipLevels == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar1 = (t->d_ptr).d;
  (t->d_ptr).d = (QOpenGLTexturePrivate *)0x0;
  *(QOpenGLTexturePrivate **)debug.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QOpenGLTexture *t)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QOpenGLTexture(";
    if (t) {
        const QOpenGLTexturePrivate *d = t->d_ptr.data();
        debug << d->target << ", bindingTarget=" << d->bindingTarget
            << ", size=[" << d->dimensions[0]
            << ", " << d->dimensions[1];
        if (d->target == QOpenGLTexture::Target3D)
            debug << ", " << d->dimensions[2];
        debug << "], format=" << d->format << ", formatClass=" << d->formatClass;
        if (t->isCreated())
            debug << ", textureId=" << d->textureId;
        if (t->isBound())
            debug << ", [bound]";
        if (t->isTextureView())
            debug << ", [view]";
        if (d->fixedSamplePositions)
            debug << ", [fixedSamplePositions]";
        debug << ", mipLevels=" << d->requestedMipLevels << ", layers=" << d->layers
            << ", faces=" << d->faces << ", samples=" << d->samples
            << ", depthStencilMode=" << d->depthStencilMode << ", comparisonFunction="
            << d->comparisonFunction << ", comparisonMode=" << d->comparisonMode
            << ", features=" << d->features << ", minificationFilter=" << d->minFilter
            << ", magnificationFilter=" << d->magFilter << ", wrapMode=" << d->wrapModes[0];
    } else {
        debug << '0';
    }
    debug << ')';
    return debug;
}